

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::RemoveNode(GraphCycles *this,void *ptr)

{
  uint v;
  Rep *pRVar1;
  Node *pNVar2;
  bool bVar3;
  int *piVar4;
  int *piVar5;
  ulong uVar6;
  int32_t y;
  int32_t _cursor;
  int32_t i;
  uint local_44 [3];
  Node *local_38;
  
  pRVar1 = this->rep_;
  piVar5 = (pRVar1->ptrmap_).table_._M_elems + (ulong)ptr % 0x3fffb;
  do {
    piVar4 = piVar5;
    v = *piVar4;
    uVar6 = (ulong)v;
    if (uVar6 == 0xffffffff) {
      return;
    }
    pNVar2 = ((pRVar1->ptrmap_).nodes_)->ptr_[uVar6];
    piVar5 = &pNVar2->next_hash;
  } while ((pNVar2->masked_ptr ^ (ulong)ptr) != 0xf03a5f7bf03a5f7b);
  *piVar4 = *piVar5;
  *piVar5 = -1;
  pNVar2 = (pRVar1->nodes_).ptr_[uVar6];
  local_44[1] = 0;
  local_44[2] = v;
  while (bVar3 = synchronization_internal::anon_unknown_0::NodeSet::Next
                           (&pNVar2->out,(int32_t *)(local_44 + 1),(int32_t *)local_44), bVar3) {
    synchronization_internal::anon_unknown_0::NodeSet::erase
              (&(this->rep_->nodes_).ptr_[local_44[0]]->in,v);
  }
  local_44[1] = 0;
  local_38 = pNVar2;
  while (bVar3 = synchronization_internal::anon_unknown_0::NodeSet::Next
                           (&pNVar2->in,(int32_t *)(local_44 + 1),(int32_t *)local_44), bVar3) {
    synchronization_internal::anon_unknown_0::NodeSet::erase
              (&(this->rep_->nodes_).ptr_[local_44[0]]->out,v);
  }
  synchronization_internal::anon_unknown_0::NodeSet::Init(&pNVar2->in);
  synchronization_internal::anon_unknown_0::NodeSet::Init(&pNVar2->out);
  local_38->masked_ptr = 0xf03a5f7bf03a5f7b;
  if (local_38->version != 0xffffffff) {
    local_38->version = local_38->version + 1;
    synchronization_internal::anon_unknown_0::Vec<int>::push_back
              (&this->rep_->free_nodes_,(int *)(local_44 + 2));
  }
  return;
}

Assistant:

void GraphCycles::RemoveNode(void* ptr) {
  int32_t i = rep_->ptrmap_.Remove(ptr);
  if (i == -1) {
    return;
  }
  Node* x = rep_->nodes_[static_cast<uint32_t>(i)];
  HASH_FOR_EACH(y, x->out) {
    rep_->nodes_[static_cast<uint32_t>(y)]->in.erase(i);
  }
  HASH_FOR_EACH(y, x->in) {
    rep_->nodes_[static_cast<uint32_t>(y)]->out.erase(i);
  }
  x->in.clear();
  x->out.clear();
  x->masked_ptr = base_internal::HidePtr<void>(nullptr);
  if (x->version == std::numeric_limits<uint32_t>::max()) {
    // Cannot use x any more
  } else {
    x->version++;  // Invalidates all copies of node.
    rep_->free_nodes_.push_back(i);
  }
}